

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shknam.c
# Opt level: O0

boolean saleable(monst *shkp,obj *obj)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  shclass *shp;
  int shp_indx;
  int i;
  obj *obj_local;
  monst *shkp_local;
  
  lVar1 = (long)((short)shkp[0x1b].misc_worn_check + -0x12);
  lVar2 = lVar1 * 0xc0;
  if (shtypes[lVar1].symb == '\0') {
    return '\x01';
  }
  shp._4_4_ = 0;
  while( true ) {
    bVar3 = false;
    if (shp._4_4_ < 0x14) {
      bVar3 = *(int *)(lVar2 + 0x3cd064 + (long)shp._4_4_ * 8) != 0;
    }
    if (!bVar3) break;
    if (*(int *)(lVar2 + 0x3cd068 + (long)shp._4_4_ * 8) < 0) {
      if (*(int *)(lVar2 + 0x3cd068 + (long)shp._4_4_ * 8) == -(int)obj->otyp) {
        return '\x01';
      }
    }
    else if (*(int *)(lVar2 + 0x3cd068 + (long)shp._4_4_ * 8) == (int)obj->oclass) {
      return '\x01';
    }
    shp._4_4_ = shp._4_4_ + 1;
  }
  return '\0';
}

Assistant:

boolean saleable(struct monst *shkp, struct obj *obj)
{
    int i, shp_indx = ESHK(shkp)->shoptype - SHOPBASE;
    const struct shclass *shp = &shtypes[shp_indx];

    if (shp->symb == RANDOM_CLASS) return TRUE;
    else for (i = 0; i < SIZE(shtypes[0].iprobs) && shp->iprobs[i].iprob; i++)
		if (shp->iprobs[i].itype < 0 ?
			shp->iprobs[i].itype == - obj->otyp :
			shp->iprobs[i].itype == obj->oclass) return TRUE;
    /* not found */
    return FALSE;
}